

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  xmlNodePtr node_00;
  PyObject *pPVar1;
  undefined8 uVar2;
  PyObject *ns;
  xmlNodePtr node_1;
  _xmlNode *p_Stack_30;
  int i_1;
  xmlNodePtr node;
  int len;
  int i;
  PyObject *ret;
  xmlXPathObjectPtr obj_local;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    obj_local = (xmlXPathObjectPtr)&_Py_NoneStruct;
  }
  else {
    switch(obj->type) {
    case XPATH_NODESET:
      if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
        _len = (xmlXPathObjectPtr)PyList_New(0);
      }
      else {
        _len = (xmlXPathObjectPtr)PyList_New((long)obj->nodesetval->nodeNr);
        for (node_1._4_4_ = 0; node_1._4_4_ < obj->nodesetval->nodeNr;
            node_1._4_4_ = node_1._4_4_ + 1) {
          node_00 = obj->nodesetval->nodeTab[node_1._4_4_];
          if (node_00->type == XML_NAMESPACE_DECL) {
            uVar2 = PyCapsule_New(node_00,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
            PyList_SetItem(_len,(long)node_1._4_4_,uVar2);
            obj->nodesetval->nodeTab[node_1._4_4_] = (xmlNodePtr)0x0;
          }
          else {
            pPVar1 = libxml_xmlNodePtrWrap(node_00);
            PyList_SetItem(_len,(long)node_1._4_4_,pPVar1);
          }
        }
      }
      break;
    case XPATH_BOOLEAN:
      _len = (xmlXPathObjectPtr)PyLong_FromLong((long)obj->boolval);
      break;
    case XPATH_NUMBER:
      _len = (xmlXPathObjectPtr)PyFloat_FromDouble(obj->floatval);
      break;
    case XPATH_STRING:
      _len = (xmlXPathObjectPtr)PyUnicode_FromString(obj->stringval);
      break;
    default:
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      _len = (xmlXPathObjectPtr)&_Py_NoneStruct;
      break;
    case XPATH_XSLT_TREE:
      if (((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) ||
         (obj->nodesetval->nodeTab == (xmlNodePtr *)0x0)) {
        _len = (xmlXPathObjectPtr)PyList_New(0);
      }
      else {
        node._0_4_ = 0;
        for (p_Stack_30 = (*obj->nodesetval->nodeTab)->children; p_Stack_30 != (_xmlNode *)0x0;
            p_Stack_30 = p_Stack_30->next) {
          node._0_4_ = (int)node + 1;
        }
        _len = (xmlXPathObjectPtr)PyList_New((long)(int)node);
        p_Stack_30 = (*obj->nodesetval->nodeTab)->children;
        for (node._4_4_ = 0; node._4_4_ < (int)node; node._4_4_ = node._4_4_ + 1) {
          pPVar1 = libxml_xmlNodePtrWrap(p_Stack_30);
          PyList_SetItem(_len,(long)node._4_4_,pPVar1);
          p_Stack_30 = p_Stack_30->next;
        }
      }
      return (PyObject *)_len;
    }
    xmlXPathFreeObject(obj);
    obj_local = _len;
  }
  return (PyObject *)obj_local;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        default:
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}